

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

void Col_WordAddSynonym(Col_Word *wordPtr,Col_Word synonym)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  Col_Word tmp;
  Col_Word word;
  Col_Word synonym_local;
  Col_Word *wordPtr_local;
  
  if ((*wordPtr != 0) && (synonym != 0)) {
    word = synonym;
    synonym_local = (Col_Word)wordPtr;
    iVar3 = HasSynonymField(*wordPtr);
    if (iVar3 == 0) {
      AddSynonymField((Col_Word *)synonym_local);
    }
    else {
      tmp = *(Col_Word *)synonym_local;
      do {
        if (tmp == word) {
          return;
        }
        iVar3 = HasSynonymField(tmp);
      } while ((iVar3 != 0) && (tmp = *(Col_Word *)(tmp + 8), tmp != *(Col_Word *)synonym_local));
    }
    lVar1 = *(long *)synonym_local;
    iVar3 = HasSynonymField(word);
    if (iVar3 == 0) {
      if (*(long *)(lVar1 + 8) == 0) {
        *(Col_Word *)(lVar1 + 8) = word;
        return;
      }
      AddSynonymField(&word);
    }
    if (*(long *)(lVar1 + 8) == 0) {
      *(long *)(lVar1 + 8) = lVar1;
    }
    else {
      iVar3 = HasSynonymField(*(Col_Word *)(lVar1 + 8));
      if (iVar3 == 0) {
        AddSynonymField((Col_Word *)(lVar1 + 8));
        *(long *)(*(long *)(lVar1 + 8) + 8) = lVar1;
      }
    }
    if (*(long *)(word + 8) == 0) {
      *(Col_Word *)(word + 8) = word;
    }
    else {
      iVar3 = HasSynonymField(*(Col_Word *)(word + 8));
      if (iVar3 == 0) {
        AddSynonymField((Col_Word *)(word + 8));
        *(Col_Word *)(*(long *)(word + 8) + 8) = word;
      }
    }
    uVar2 = *(undefined8 *)(lVar1 + 8);
    *(undefined8 *)(lVar1 + 8) = *(undefined8 *)(word + 8);
    *(undefined8 *)(word + 8) = uVar2;
  }
  return;
}

Assistant:

void
Col_WordAddSynonym(
    Col_Word *wordPtr,  /*!< Point to the word to add synonym to. May be
                             modified in the process (in this case the original
                             word will be part of the returned word's synonym
                             chain). */
    Col_Word synonym)   /*!< The synonym to add. */
{
    Col_Word word;

    /*
     * Quick cases.
     */

    if (!*wordPtr || !synonym) {
        /*
         * Nil can't have synonyms.
         */

        return;
    }

    if (!HasSynonymField(*wordPtr)) {
        AddSynonymField(wordPtr);
    } else {
        /*
         * Ensure that synonym is not already part of word's chain.
         */

        word = *wordPtr;
        do {
            if (word == synonym) return;
            if (!HasSynonymField(word)) break;
            word = WORD_SYNONYM(word);
        } while (word != *wordPtr);
    }
    word = *wordPtr;

    if (!HasSynonymField(synonym)) {
        if (!WORD_SYNONYM(word)) {
            /*
             * Word has no current synonym, simply add the new one without
             * wrapping the synonym.
             */

            WORD_SYNONYM(word) = synonym;
            return;
        }
        AddSynonymField(&synonym);
    }

    /*
     * Synonym-less words have a nil synonym pointer. Words with one synonym
     * without synonym field itself simply point to it. Larger synonym chains
     * must be circular lists of words with synonym fields. Here, ensure that
     * both word and synonym's synonym chains are circular lists.
     */

    ASSERT(HasSynonymField(word));
    ASSERT(HasSynonymField(synonym));
    if (!WORD_SYNONYM(word)) {
        WORD_SYNONYM(word) = word;
    } else if (!HasSynonymField(WORD_SYNONYM(word))) {
        AddSynonymField(&WORD_SYNONYM(word));
        WORD_SYNONYM(WORD_SYNONYM(word)) = word;
    }
    if (!WORD_SYNONYM(synonym)) {
        WORD_SYNONYM(synonym) = synonym;
    } else if (!HasSynonymField(WORD_SYNONYM(synonym))) {
        AddSynonymField(&WORD_SYNONYM(synonym));
        WORD_SYNONYM(WORD_SYNONYM(synonym)) = synonym;
    }

    /*
     * Merging circular lists is simply done by exchanging the heads' next
     * pointers.
     */

    {
        Col_Word tmp = WORD_SYNONYM(word);
        WORD_SYNONYM(word) = WORD_SYNONYM(synonym);
        WORD_SYNONYM(synonym) = tmp;
    }
}